

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>
fmt::v8::detail::
do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::big_decimal_fp,wchar_t,fmt::v8::detail::digit_grouping<wchar_t>>
          (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out,big_decimal_fp *fp,
          basic_format_specs<wchar_t> *specs,float_specs fspecs,locale_ref loc)

{
  uint uVar1;
  int *piVar2;
  long lVar3;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> bVar4;
  wchar_t wVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  basic_format_specs<wchar_t> *significand_00;
  ulong uVar9;
  char cVar10;
  ulong uVar11;
  char *pcVar12;
  char *pcVar13;
  wchar_t wVar14;
  byte bVar15;
  long lVar16;
  ulong uVar17;
  size_t sVar18;
  bool pointy;
  int significand_size;
  wchar_t decimal_point;
  sign_t sign;
  wchar_t zero;
  char *significand;
  int exp;
  digit_grouping<wchar_t> grouping;
  anon_class_40_8_c3c31ef8 write;
  wchar_t local_ec;
  wchar_t local_e8;
  undefined1 local_e4 [40];
  buffer<wchar_t> local_bc;
  int local_98;
  ulong local_90;
  ulong local_88;
  undefined1 local_80 [8];
  undefined1 local_78 [24];
  undefined8 local_60;
  undefined8 local_58;
  digit_grouping<wchar_t> *local_50;
  wchar_t *local_48;
  wchar_t *local_40;
  undefined1 *local_38;
  
  local_e4._28_8_ = fp->significand;
  wVar5 = fp->significand_size;
  local_e4._8_4_ = 0x30;
  uVar9 = (ulong)fspecs >> 0x28 & 0xff;
  local_e4._4_4_ = (undefined4)uVar9;
  local_e8 = wVar5;
  local_80 = (undefined1  [8])fspecs;
  if (wVar5 < L'\0') {
LAB_00178f90:
    fmt::v8::detail::assert_fail
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
               ,0x195,"negative value");
  }
  uVar11 = (ulong)(uint)((wVar5 + L'\x01') - (uint)(local_e4._4_4_ == 0));
  local_e4._0_4_ = L'.';
  uVar8 = fspecs._4_4_;
  significand_00 = (basic_format_specs<wchar_t> *)local_e4._28_8_;
  if ((uVar8 >> 0x11 & 1) != 0) {
    local_e4._12_8_ = local_e4._28_8_;
    local_e4._20_8_ = fp;
    local_90 = uVar9;
    local_88 = (ulong)(uint)wVar5;
    local_e4._0_4_ = fmt::v8::detail::decimal_point_impl<wchar_t>(loc);
    wVar5 = (wchar_t)local_88;
    significand_00 = (basic_format_specs<wchar_t> *)local_e4._12_8_;
    fp = (big_decimal_fp *)local_e4._20_8_;
    uVar9 = local_90;
  }
  uVar1 = *(int *)((long)&((buffer<wchar_t> *)fp)->ptr_ + 4);
  local_bc._vptr_buffer._0_4_ = wVar5 + uVar1;
  iVar7 = fspecs.precision;
  if (fspecs._4_1_ == '\x01') {
LAB_00178c01:
    iVar6 = wVar5 + uVar1 + -1;
    if ((uVar8 >> 0x14 & 1) == 0) {
      uVar17 = 0;
      if (wVar5 == L'\x01') {
        local_e4._0_4_ = L'\0';
        uVar17 = 0;
      }
    }
    else {
      uVar17 = 0;
      if (0 < iVar7 - wVar5) {
        uVar17 = (ulong)(uint)(iVar7 - wVar5);
      }
      uVar11 = uVar11 + uVar17;
    }
    bVar15 = ((uVar8 >> 0x10 & 1) == 0) << 5;
    local_78._0_4_ = (int)uVar9;
    wVar14 = (wchar_t)uVar17;
    local_60._4_4_ = 0x30;
    local_60._0_4_ = wVar14;
    local_58 = (digit_grouping<wchar_t> *)
               (CONCAT44(iVar6,(int)CONCAT71(local_58._1_7_,bVar15)) | 0x45);
    local_78._8_8_ = significand_00;
    local_78._16_4_ = wVar5;
    local_78._20_4_ = local_e4._0_4_;
    if (0 < specs->width) {
      if ((int)local_bc._vptr_buffer < 1) {
        iVar6 = 1 - (int)local_bc._vptr_buffer;
      }
      lVar16 = 2;
      if (99 < iVar6) {
        lVar16 = (ulong)(999 < iVar6) + 3;
      }
      sVar18 = uVar11 + (3 - (ulong)(local_e4._0_4_ == L'\0')) + lVar16;
      bVar4 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::big_decimal_fp,wchar_t,fmt::v8::detail::digit_grouping<wchar_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_&>
                        (out,specs,sVar18,sVar18,(anon_class_40_8_c3c31ef8 *)(local_80 + 8));
      return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar4.container;
    }
    if ((int)uVar9 != 0) {
      cVar10 = ""[uVar9];
      sVar18 = (out.container)->size_;
      uVar9 = sVar18 + 1;
      if ((out.container)->capacity_ < uVar9) {
        (**(out.container)->_vptr_buffer)(out.container);
        sVar18 = (out.container)->size_;
        uVar9 = sVar18 + 1;
      }
      (out.container)->size_ = uVar9;
      (out.container)->ptr_[sVar18] = (int)cVar10;
    }
    bVar4 = write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t>
                      (out,(char *)significand_00,wVar5,1,local_78._20_4_);
    bVar15 = bVar15 | 0x45;
    if (wVar14 != L'\0') {
      bVar4 = fill_n<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,int,wchar_t>
                        (bVar4,wVar14,(wchar_t *)((long)&local_60 + 4));
      bVar15 = (byte)local_58;
    }
    sVar18 = (bVar4.container)->size_;
    uVar9 = sVar18 + 1;
    if ((bVar4.container)->capacity_ < uVar9) {
      (**(bVar4.container)->_vptr_buffer)(bVar4.container);
      sVar18 = (bVar4.container)->size_;
      uVar9 = sVar18 + 1;
    }
    (bVar4.container)->size_ = uVar9;
    (bVar4.container)->ptr_[sVar18] = (int)(char)bVar15;
    bVar4 = write_exponent<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                      (local_58._4_4_,bVar4);
    return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar4.container;
  }
  if (((ulong)fspecs & 0xff00000000) == 0) {
    iVar6 = 0x10;
    if (0 < iVar7) {
      iVar6 = iVar7;
    }
    if (((int)local_bc._vptr_buffer < -3) || (iVar6 < (int)local_bc._vptr_buffer))
    goto LAB_00178c01;
  }
  if ((int)uVar1 < 0) {
    if ((int)local_bc._vptr_buffer < 1) {
      iVar6 = -(int)local_bc._vptr_buffer;
      local_bc._vptr_buffer._4_4_ = iVar6;
      if (SBORROW4(iVar7,iVar6) != iVar7 + (int)local_bc._vptr_buffer < 0) {
        local_bc._vptr_buffer._4_4_ = iVar7;
      }
      if (iVar7 < 0) {
        local_bc._vptr_buffer._4_4_ = iVar6;
      }
      if (wVar5 != L'\0') {
        local_bc._vptr_buffer._4_4_ = iVar6;
      }
      if (wVar5 == L'\0' && local_bc._vptr_buffer._4_4_ == 0) {
        local_ec = CONCAT31(local_ec._1_3_,(char)((uVar8 & 0x100000) >> 0x14));
        iVar7 = 2 - (uint)(((ulong)fspecs & 0x10000000000000) == 0);
      }
      else {
        local_ec = CONCAT31(local_ec._1_3_,1);
        iVar7 = 2;
        if (local_bc._vptr_buffer._4_4_ < 0) goto LAB_00178f90;
      }
      sVar18 = (uint)(iVar7 + local_bc._vptr_buffer._4_4_) + uVar11;
      local_78._0_8_ = local_e4 + 4;
      local_78._8_8_ = local_e4 + 8;
      local_78._16_8_ = &local_ec;
      local_60 = (buffer<wchar_t> *)local_e4;
      local_58 = (digit_grouping<wchar_t> *)((long)&local_bc._vptr_buffer + 4);
      local_50 = (digit_grouping<wchar_t> *)(local_e4 + 0x1c);
      local_48 = &local_e8;
      bVar4 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::big_decimal_fp,wchar_t,fmt::v8::detail::digit_grouping<wchar_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_4_&>
                        (out,specs,sVar18,sVar18,(anon_class_56_7_162c6e41 *)(local_80 + 8));
      return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar4.container;
    }
    wVar14 = L'\0';
    local_ec = iVar7 - wVar5 & (int)(uVar8 << 0xb) >> 0x1f;
    wVar5 = local_ec;
    if (local_ec < L'\x01') {
      wVar5 = L'\0';
    }
    piVar2 = (int *)((long)&local_bc._vptr_buffer + 4);
    local_e4._12_8_ = specs;
    local_e4._20_8_ = out.container;
    digit_grouping<wchar_t>::digit_grouping
              ((digit_grouping<wchar_t> *)piVar2,loc,(bool)((byte)(uVar8 >> 0x11) & 1));
    if (local_98 != 0) {
      pcVar12 = (char *)CONCAT44(local_bc.ptr_._0_4_,local_bc._vptr_buffer._4_4_);
      pcVar13 = pcVar12 + local_bc._12_8_;
      lVar16 = 0;
      do {
        if (pcVar12 == pcVar13) {
          cVar10 = pcVar13[-1];
          pcVar12 = pcVar13;
        }
        else {
          cVar10 = *pcVar12;
          if ((byte)(cVar10 + 0x81U) < 0x82) goto LAB_00178fb4;
          pcVar12 = pcVar12 + 1;
        }
        wVar14 = wVar14 + cVar10;
        if (local_e8 <= wVar14) goto LAB_00178fb4;
        lVar16 = lVar16 + 1;
      } while( true );
    }
    lVar16 = 0;
LAB_00178fb4:
    sVar18 = uVar11 + (uint)wVar5 + 1 + lVar16;
    local_78._0_8_ = local_e4 + 4;
    local_78._8_8_ = local_e4 + 0x1c;
    local_78._16_8_ = &local_e8;
    local_60 = &local_bc;
    local_58 = (digit_grouping<wchar_t> *)local_e4;
    local_48 = &local_ec;
    local_40 = (wchar_t *)(local_e4 + 8);
    local_50 = (digit_grouping<wchar_t> *)piVar2;
    bVar4 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::big_decimal_fp,wchar_t,fmt::v8::detail::digit_grouping<wchar_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_3_&>
                      ((back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)local_e4._20_8_,
                       (basic_format_specs<wchar_t> *)local_e4._12_8_,sVar18,sVar18,
                       (anon_class_64_8_e6ffa566 *)(local_80 + 8));
    goto LAB_0017900c;
  }
  lVar16 = uVar1 + uVar11;
  local_ec = iVar7 - (int)local_bc._vptr_buffer;
  if ((uVar8 >> 0x14 & 1) != 0) {
    if (fspecs._4_1_ == '\x02' || L'\0' < local_ec) {
      if (local_ec < L'\x01') goto LAB_00178e89;
    }
    else {
      local_ec = L'\x01';
    }
    lVar16 = lVar16 + (ulong)(uint)local_ec + 1;
  }
LAB_00178e89:
  piVar2 = (int *)((long)&local_bc._vptr_buffer + 4);
  digit_grouping<wchar_t>::digit_grouping
            ((digit_grouping<wchar_t> *)piVar2,loc,(bool)((byte)(uVar8 >> 0x11) & 1));
  wVar5 = L'\0';
  if (local_98 != 0) {
    pcVar12 = (char *)CONCAT44(local_bc.ptr_._0_4_,local_bc._vptr_buffer._4_4_);
    pcVar13 = pcVar12 + local_bc._12_8_;
    lVar3 = 0;
    do {
      if (pcVar12 == pcVar13) {
        cVar10 = pcVar13[-1];
        pcVar12 = pcVar13;
      }
      else {
        cVar10 = *pcVar12;
        if ((byte)(cVar10 + 0x81U) < 0x82) goto LAB_00178ef9;
        pcVar12 = pcVar12 + 1;
      }
      wVar5 = wVar5 + cVar10;
      if (local_e8 <= wVar5) goto LAB_00178ef9;
      lVar3 = lVar3 + 1;
    } while( true );
  }
  lVar3 = 0;
LAB_00178ef9:
  local_78._0_8_ = local_e4 + 4;
  local_78._8_8_ = local_e4 + 0x1c;
  local_78._16_8_ = &local_e8;
  local_50 = (digit_grouping<wchar_t> *)local_80;
  local_48 = (wchar_t *)local_e4;
  local_40 = &local_ec;
  local_38 = local_e4 + 8;
  local_60 = (buffer<wchar_t> *)fp;
  local_58 = (digit_grouping<wchar_t> *)piVar2;
  bVar4 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::big_decimal_fp,wchar_t,fmt::v8::detail::digit_grouping<wchar_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_2_&>
                    (out,specs,lVar16 + lVar3,lVar16 + lVar3,
                     (anon_class_72_9_d68ba176 *)(local_80 + 8));
LAB_0017900c:
  if ((int *)CONCAT44(local_bc.ptr_._0_4_,local_bc._vptr_buffer._4_4_) !=
      (int *)((long)&local_bc.size_ + 4U)) {
    operator_delete((int *)CONCAT44(local_bc.ptr_._0_4_,local_bc._vptr_buffer._4_4_),
                    local_bc._20_8_ + 1);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar4.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& fp,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  constexpr Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   fp.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}